

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O1

void __thiscall timeoutProblems_timeoutFiles_Test::TestBody(timeoutProblems_timeoutFiles_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ParamType *pPVar3;
  uint64_t uVar4;
  precise_unit *un;
  uint64_t in_RCX;
  char *in_R9;
  pointer *__ptr;
  double dVar5;
  precise_unit pVar6;
  TrueWithString gtest_msg;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string cdata;
  string local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  AssertHelper local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  precise_unit local_a0;
  AssertHelper local_90;
  double local_88;
  string local_80;
  string local_60;
  string local_40;
  
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"timeout","");
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  loadFailureFile(&local_80,&local_f8,*pPVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_c0[0] = (internal)(local_80._M_string_length != 0);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80._M_string_length == 0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,(AssertionResult *)"cdata.empty()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x44,local_f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_a0.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_a0.multiplier_ + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  else {
    local_a0 = (precise_unit)ZEXT816(0x3ff0000000000000);
    local_f8.field_2._8_8_ = 0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      uVar4 = units::getDefaultFlags();
      local_a0 = units::unit_from_string(&local_40,uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((!NAN(local_a0.multiplier_)) && (local_a0.base_units_ != (unit_data)0xfa94a488)) {
      un = (precise_unit *)units::getDefaultFlags();
      units::to_string_abi_cxx11_(&local_f8,(units *)&local_a0,un,in_RCX);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,local_f8._M_dataplus._M_p,
                 local_f8._M_dataplus._M_p + local_f8._M_string_length);
      uVar4 = units::getDefaultFlags();
      pVar6 = units::unit_from_string(&local_60,uVar4);
      dVar5 = pVar6.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        local_88 = pVar6.multiplier_;
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        dVar5 = local_88;
      }
      bVar2 = pVar6.base_units_ != (unit_data)0xfa94a488;
      local_d0.data_._0_1_ = (internal)(bVar2 && !NAN(dVar5));
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2 || NAN(dVar5)) {
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c0,(internal *)&local_d0,(AssertionResult *)"is_error(u2)","true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                   ,0x4a,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1
                         );
        }
        if (local_d8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_d8._M_head_impl + 8))();
        }
      }
      if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8,local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(fuzzFailures, rtripconversions6)
{
    std::string tstring = "V\xb2";
    tstring += "+*";
    auto u1 = unit_from_string(tstring);
    EXPECT_TRUE(is_error(u1));
}